

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_distance.cpp
# Opt level: O3

void duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  undefined1 *puVar1;
  VectorType VVar2;
  VectorType VVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  SelectionVector *count;
  unsigned_long *puVar8;
  double *pdVar9;
  list_entry_t *plVar10;
  data_ptr_t pdVar11;
  data_ptr_t pdVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  _Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_> _Var14;
  ulong uVar15;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var16;
  undefined4 uVar19;
  undefined4 uVar20;
  data_ptr_t pdVar17;
  undefined4 uVar21;
  undefined4 uVar22;
  pointer pcVar18;
  byte bVar23;
  double dVar24;
  anon_class_24_3_3d016869 fun;
  anon_class_24_3_3d016869 fun_00;
  anon_class_24_3_3d016869 fun_01;
  anon_class_24_3_3d016869 fun_02;
  anon_class_24_3_3d016869 fun_03;
  anon_class_24_3_3d016869 fun_04;
  anon_class_24_3_3d016869 fun_05;
  anon_class_24_3_3d016869 fun_06;
  anon_class_24_3_3d016869 fun_07;
  anon_class_24_3_3d016869 fun_08;
  anon_class_24_3_3d016869 fun_09;
  anon_class_24_3_3d016869 fun_10;
  undefined8 uVar25;
  undefined8 uVar26;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var27;
  data_ptr_t pdVar28;
  bool bVar29;
  BoundFunctionExpression *pBVar30;
  reference vec;
  reference vec_00;
  idx_t iVar31;
  idx_t count_00;
  Vector *this;
  Vector *this_00;
  idx_t iVar32;
  TemplatedValidityData<unsigned_long> *pTVar33;
  SelectionVector *pSVar34;
  _Head_base<0UL,_unsigned_long_*,_false> _Var35;
  InvalidInputException *pIVar36;
  SelectionVector *pSVar37;
  SelectionVector *pSVar38;
  idx_t idx_in_entry;
  ulong uVar39;
  ulong uVar40;
  string *psVar41;
  uint64_t *puVar42;
  ValidityMask *pVVar43;
  ulong uVar44;
  long lVar45;
  list_entry_t left;
  list_entry_t left_00;
  list_entry_t left_01;
  list_entry_t left_02;
  list_entry_t lVar46;
  list_entry_t left_03;
  list_entry_t left_04;
  list_entry_t left_05;
  list_entry_t right;
  list_entry_t right_00;
  list_entry_t right_01;
  list_entry_t right_02;
  list_entry_t right_03;
  list_entry_t right_04;
  list_entry_t right_05;
  list_entry_t right_06;
  UnifiedVectorFormat ldata;
  double *rhs_data;
  double *lhs_data;
  uint64_t *local_190;
  undefined1 local_138 [16];
  SelectionVector local_128 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  SelectionVector *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  DataChunk *local_d8;
  idx_t local_d0;
  UnifiedVectorFormat local_c8;
  double *local_80;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pBVar30 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  count = (SelectionVector *)args->count;
  vec = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  local_d8 = args;
  vec_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  iVar31 = ListVector::GetListSize(vec);
  count_00 = ListVector::GetListSize(vec_00);
  this = ListVector::GetEntry(vec);
  this_00 = ListVector::GetEntry(vec_00);
  Vector::Flatten(this,iVar31);
  Vector::Flatten(this_00,count_00);
  FlatVector::VerifyFlatVector(this);
  iVar32 = TemplatedValidityMask<unsigned_long>::CountValid
                     (&(this->validity).super_TemplatedValidityMask<unsigned_long>,iVar31);
  if (iVar32 != iVar31) {
    pIVar36 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_138._0_8_ = local_128;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"%s: left argument can not contain NULL values","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar18 = (pBVar30->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
              _M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar18,
               pcVar18 + (pBVar30->function).super_BaseScalarFunction.super_SimpleFunction.
                         super_Function.name._M_string_length);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar36,(string *)local_138,&local_50);
    __cxa_throw(pIVar36,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  FlatVector::VerifyFlatVector(this_00);
  iVar31 = TemplatedValidityMask<unsigned_long>::CountValid
                     (&(this_00->validity).super_TemplatedValidityMask<unsigned_long>,count_00);
  if (iVar31 != count_00) {
    pIVar36 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_138._0_8_ = local_128;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"%s: right argument can not contain NULL values","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    pcVar18 = (pBVar30->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
              _M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar18,
               pcVar18 + (pBVar30->function).super_BaseScalarFunction.super_SimpleFunction.
                         super_Function.name._M_string_length);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar36,(string *)local_138,&local_70);
    __cxa_throw(pIVar36,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  psVar41 = &(pBVar30->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name;
  local_78 = (undefined1  [8])this->data;
  local_80 = (double *)this_00->data;
  VVar2 = vec->vector_type;
  VVar3 = vec_00->vector_type;
  if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar8 = (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    pdVar9 = (double *)result->data;
    if (((puVar8 == (unsigned_long *)0x0) || ((*puVar8 & 1) != 0)) &&
       ((puVar8 = (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar8 == (unsigned_long *)0x0 || ((*puVar8 & 1) != 0)))) {
      fun.lhs_data = (double **)local_78;
      fun.func_name = psVar41;
      fun.rhs_data = &local_80;
      dVar24 = BinaryLambdaWrapperWithNulls::
               Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                         (fun,*(list_entry_t *)vec->data,*(list_entry_t *)vec_00->data,
                          &result->validity,0);
      *pdVar9 = dVar24;
      goto LAB_01bae6d8;
    }
  }
  else {
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
      plVar10 = (list_entry_t *)vec_00->data;
      puVar8 = (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar11 = vec->data;
      if ((puVar8 == (unsigned_long *)0x0) || ((*puVar8 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar12 = result->data;
        FlatVector::VerifyFlatVector(result);
        pVVar43 = &result->validity;
        FlatVector::VerifyFlatVector(vec);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
        if ((vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_c8.sel = count;
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          }
          (pVVar43->super_TemplatedValidityMask<unsigned_long>).validity_mask = (unsigned_long *)0x0
          ;
        }
        else {
          local_c8.sel = count;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)local_138,(unsigned_long **)&vec->validity,(unsigned_long *)&local_c8
                    );
          uVar26 = local_138._8_8_;
          uVar25 = local_138._0_8_;
          local_138._0_8_ = (SelectionVector *)0x0;
          local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)uVar25;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar26;
          if ((p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
          }
          pTVar33 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar33->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          (pVVar43->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)_Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          if (_Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
              (unsigned_long *)0x0) {
            puVar1 = (undefined1 *)
                     ((long)&count[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + 7);
            local_138._0_8_ = psVar41;
            local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78;
            local_128[0].sel_vector = (sel_t *)&local_80;
            if ((undefined1 *)0x3f < puVar1) {
              pSVar38 = (SelectionVector *)0x0;
              uVar40 = 0;
              do {
                puVar8 = (pVVar43->super_TemplatedValidityMask<unsigned_long>).validity_mask;
                if (puVar8 == (unsigned_long *)0x0) {
                  pSVar34 = (SelectionVector *)
                            &pSVar38[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount;
                  if (count <= pSVar34) {
                    pSVar34 = count;
                  }
LAB_01bae5f0:
                  pSVar37 = pSVar38;
                  if (pSVar38 < pSVar34) {
                    lVar46 = *plVar10;
                    puVar42 = (uint64_t *)(pdVar11 + (long)pSVar38 * 0x10 + 8);
                    do {
                      fun_01.lhs_data = (double **)local_78;
                      fun_01.func_name = psVar41;
                      fun_01.rhs_data = &local_80;
                      left_00.length = *puVar42;
                      left_00.offset = puVar42[-1];
                      dVar24 = BinaryLambdaWrapperWithNulls::
                               Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                         (fun_01,left_00,lVar46,pVVar43,(idx_t)pSVar38);
                      *(double *)(pdVar12 + (long)pSVar38 * 8) = dVar24;
                      pSVar38 = (SelectionVector *)
                                ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar38->sel_vector
                                         )->
                                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                        )._M_t.
                                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                        ._M_t + 1);
                      puVar42 = puVar42 + 2;
                      pSVar37 = pSVar34;
                    } while (pSVar34 != pSVar38);
                  }
                }
                else {
                  uVar15 = puVar8[uVar40];
                  pSVar34 = (SelectionVector *)
                            &pSVar38[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount;
                  if (count <= pSVar34) {
                    pSVar34 = count;
                  }
                  pSVar37 = pSVar34;
                  if (uVar15 != 0) {
                    if (uVar15 == 0xffffffffffffffff) goto LAB_01bae5f0;
                    pSVar37 = pSVar38;
                    if (pSVar38 < pSVar34) {
                      puVar42 = (uint64_t *)(pdVar11 + (long)pSVar38 * 0x10 + 8);
                      uVar39 = 0;
                      do {
                        if ((uVar15 >> (uVar39 & 0x3f) & 1) != 0) {
                          fun_00.lhs_data = (double **)local_78;
                          fun_00.func_name = psVar41;
                          fun_00.rhs_data = &local_80;
                          left.length = *puVar42;
                          left.offset = puVar42[-1];
                          dVar24 = BinaryLambdaWrapperWithNulls::
                                   Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                             (fun_00,left,*plVar10,pVVar43,
                                              (long)&(((unsafe_unique_array<unsigned_long> *)
                                                      &pSVar38->sel_vector)->
                                                                                                          
                                                  super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                                  )._M_t.
                                                  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                                  ._M_t + uVar39);
                          *(double *)(pdVar12 + uVar39 * 8 + (long)pSVar38 * 8) = dVar24;
                        }
                        uVar39 = uVar39 + 1;
                        puVar42 = puVar42 + 2;
                        pSVar37 = pSVar34;
                      } while ((long)pSVar34 - (long)pSVar38 != uVar39);
                    }
                  }
                }
                pSVar38 = pSVar37;
                uVar40 = uVar40 + 1;
              } while (uVar40 != (ulong)puVar1 >> 6);
            }
            goto LAB_01bae6d8;
          }
        }
        local_138._0_8_ = psVar41;
        local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78;
        local_128[0].sel_vector = (sel_t *)&local_80;
        if (count != (SelectionVector *)0x0) {
          lVar46 = *plVar10;
          local_190 = (uint64_t *)(pdVar11 + 8);
          pSVar38 = (SelectionVector *)0x0;
          do {
            fun_05.lhs_data = (double **)local_138._8_8_;
            fun_05.func_name = (string *)local_138._0_8_;
            fun_05.rhs_data = (double **)local_128[0].sel_vector;
            left_02.length = *local_190;
            left_02.offset = local_190[-1];
            dVar24 = BinaryLambdaWrapperWithNulls::
                     Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                               (fun_05,left_02,lVar46,pVVar43,(idx_t)pSVar38);
            *(double *)(pdVar12 + (long)pSVar38 * 8) = dVar24;
            pSVar38 = (SelectionVector *)
                      ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar38->sel_vector)->
                              super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                              )._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t + 1);
            local_190 = local_190 + 2;
          } while (count != pSVar38);
        }
        goto LAB_01bae6d8;
      }
    }
    else {
      if ((VVar2 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_138);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c8);
          Vector::ToUnifiedFormat(vec,(idx_t)count,(UnifiedVectorFormat *)local_138);
          Vector::ToUnifiedFormat(vec_00,(idx_t)count,&local_c8);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar12 = local_c8.data;
          pSVar38 = local_c8.sel;
          uVar26 = local_138._8_8_;
          uVar25 = local_138._0_8_;
          pdVar11 = result->data;
          FlatVector::VerifyFlatVector(result);
          pVVar43 = &result->validity;
          if (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 && (double **)local_128[0].sel_vector == (double **)0x0) {
            if (count != (SelectionVector *)0x0) {
              lVar45 = *(long *)uVar25;
              _Var16._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                   (((unsafe_unique_array<unsigned_long> *)&pSVar38->sel_vector)->
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
              pSVar38 = (SelectionVector *)0x0;
              do {
                pSVar34 = pSVar38;
                if (lVar45 != 0) {
                  pSVar34 = (SelectionVector *)(ulong)*(uint *)(lVar45 + (long)pSVar38 * 4);
                }
                pSVar37 = pSVar38;
                if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                    _Var16._M_t.
                    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
                    (unsigned_long *)0x0) {
                  pSVar37 = (SelectionVector *)
                            (ulong)*(uint *)((long)_Var16._M_t.
                                                                                                      
                                                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                  .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                  _M_head_impl + (long)pSVar38 * 4);
                }
                uVar4 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar26 + pSVar34 * 0x10))
                        ->_M_use_count;
                uVar19 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar26 + pSVar34 * 0x10))
                         ->_M_weak_count;
                left_01.length._4_4_ = uVar19;
                left_01.length._0_4_ = uVar4;
                uVar5 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)pdVar12 + pSVar37 * 0x10))->_M_use_count;
                uVar20 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)pdVar12 + pSVar37 * 0x10))->_M_weak_count;
                right.length._4_4_ = uVar20;
                right.length._0_4_ = uVar5;
                fun_02.lhs_data = (double **)local_78;
                fun_02.func_name = psVar41;
                fun_02.rhs_data = &local_80;
                left_01.offset =
                     (uint64_t)
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar26 + pSVar34 * 0x10))->
                     _vptr__Sp_counted_base;
                right.offset = (uint64_t)
                               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)pdVar12 + pSVar37 * 0x10))->_vptr__Sp_counted_base;
                dVar24 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                   (fun_02,left_01,right,pVVar43,(idx_t)pSVar38);
                *(double *)(pdVar11 + (long)pSVar38 * 8) = dVar24;
                pSVar38 = (SelectionVector *)
                          ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar38->sel_vector)->
                                  super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                  )._M_t.
                                  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                  ._M_t + 1);
              } while (count != pSVar38);
            }
          }
          else if (count != (SelectionVector *)0x0) {
            lVar45 = *(long *)uVar25;
            _Var16._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (((unsafe_unique_array<unsigned_long> *)&pSVar38->sel_vector)->
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
            pSVar38 = (SelectionVector *)0x0;
            do {
              pSVar34 = pSVar38;
              if (lVar45 != 0) {
                pSVar34 = (SelectionVector *)(ulong)*(uint *)(lVar45 + (long)pSVar38 * 4);
              }
              pSVar37 = pSVar38;
              if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                  _Var16._M_t.
                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0
                 ) {
                pSVar37 = (SelectionVector *)
                          (ulong)*(uint *)((long)_Var16._M_t.
                                                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                 .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                 _M_head_impl + (long)pSVar38 * 4);
              }
              if ((((double **)local_128[0].sel_vector == (double **)0x0) ||
                  (((ulong)*(double **)((long)local_128[0].sel_vector + ((ulong)pSVar34 >> 6) * 8)
                    >> ((ulong)pSVar34 & 0x3f) & 1) != 0)) &&
                 ((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)pSVar37 >> 6] >> ((ulong)pSVar37 & 0x3f) & 1) != 0)))) {
                uVar6 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar26 + pSVar34 * 0x10))
                        ->_M_use_count;
                uVar21 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar26 + pSVar34 * 0x10))
                         ->_M_weak_count;
                lVar46.length._4_4_ = uVar21;
                lVar46.length._0_4_ = uVar6;
                uVar7 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)pdVar12 + pSVar37 * 0x10))->_M_use_count;
                uVar22 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)pdVar12 + pSVar37 * 0x10))->_M_weak_count;
                right_02.length._4_4_ = uVar22;
                right_02.length._0_4_ = uVar7;
                fun_06.lhs_data = (double **)local_78;
                fun_06.func_name = psVar41;
                fun_06.rhs_data = &local_80;
                lVar46.offset =
                     (uint64_t)
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar26 + pSVar34 * 0x10))->
                     _vptr__Sp_counted_base;
                right_02.offset =
                     (uint64_t)
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)pdVar12 + pSVar37 * 0x10))->_vptr__Sp_counted_base;
                dVar24 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                   (fun_06,lVar46,right_02,pVVar43,(idx_t)pSVar38);
                *(double *)(pdVar11 + (long)pSVar38 * 8) = dVar24;
              }
              else {
                _Var35._M_head_impl =
                     (pVVar43->super_TemplatedValidityMask<unsigned_long>).validity_mask;
                if (_Var35._M_head_impl == (unsigned_long *)0x0) {
                  local_d0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_e8,&local_d0);
                  p_Var27 = p_Stack_e0;
                  pSVar34 = local_e8;
                  local_e8 = (SelectionVector *)0x0;
                  p_Stack_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data.internal.
                            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)pSVar34;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var27;
                  if ((p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13),
                     p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
                  }
                  pTVar33 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  _Var35._M_head_impl =
                       (pTVar33->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (pVVar43->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                       _Var35._M_head_impl;
                }
                bVar23 = (byte)pSVar38 & 0x3f;
                _Var35._M_head_impl[(ulong)pSVar38 >> 6] =
                     _Var35._M_head_impl[(ulong)pSVar38 >> 6] &
                     (-2L << bVar23 | 0xfffffffffffffffeU >> 0x40 - bVar23);
              }
              pSVar38 = (SelectionVector *)
                        ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar38->sel_vector)->
                                super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                )._M_t.
                                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                ._M_t + 1);
            } while (count != pSVar38);
          }
          if (local_c8.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
          }
          if (local_128[0].selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_128[0].selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          goto LAB_01bae6d8;
        }
        pdVar11 = vec->data;
        pdVar12 = vec_00->data;
        local_138._0_8_ = psVar41;
        local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78;
        local_128[0].sel_vector = (sel_t *)&local_80;
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar17 = result->data;
        FlatVector::VerifyFlatVector(result);
        pVVar43 = &result->validity;
        FlatVector::VerifyFlatVector(vec);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
        local_e8 = count;
        if ((vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          }
          (pVVar43->super_TemplatedValidityMask<unsigned_long>).validity_mask = (unsigned_long *)0x0
          ;
LAB_01baeec5:
          FlatVector::VerifyFlatVector(vec_00);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
          if ((vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_e8 = count;
            if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
            }
            _Var35._M_head_impl = (unsigned_long *)0x0;
          }
          else {
            local_e8 = count;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                      ((duckdb *)&local_c8,(unsigned_long **)&vec_00->validity,
                       (unsigned_long *)&local_e8);
            pdVar28 = local_c8.data;
            pSVar38 = local_c8.sel;
            local_c8.sel = (SelectionVector *)0x0;
            local_c8.data = (data_ptr_t)0x0;
            p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)pSVar38;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar28;
            if ((p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13),
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
            }
            pTVar33 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            _Var35._M_head_impl =
                 (pTVar33->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          }
          (pVVar43->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var35._M_head_impl;
        }
        else {
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_c8,(unsigned_long **)&vec->validity,(unsigned_long *)&local_e8
                    );
          pdVar28 = local_c8.data;
          pSVar38 = local_c8.sel;
          local_c8.sel = (SelectionVector *)0x0;
          local_c8.data = (data_ptr_t)0x0;
          p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar38;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar28;
          if ((p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
          }
          pTVar33 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar33->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          (pVVar43->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)_Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          if (_Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl ==
              (unsigned_long *)0x0) goto LAB_01baeec5;
          FlatVector::VerifyFlatVector(vec_00);
          ValidityMask::Combine(pVVar43,&vec_00->validity,(idx_t)count);
          _Var35._M_head_impl = (pVVar43->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        }
        if (_Var35._M_head_impl == (unsigned_long *)0x0) {
          if (count != (SelectionVector *)0x0) {
            lVar45 = 1;
            pSVar38 = (SelectionVector *)0x0;
            do {
              fun_10.lhs_data = (double **)local_138._8_8_;
              fun_10.func_name = (string *)local_138._0_8_;
              fun_10.rhs_data = (double **)local_128[0].sel_vector;
              left_05.length = *(uint64_t *)(pdVar11 + lVar45 * 8);
              left_05.offset = *(uint64_t *)(pdVar11 + lVar45 * 8 + -8);
              right_06.length = *(uint64_t *)(pdVar12 + lVar45 * 8);
              right_06.offset = *(uint64_t *)(pdVar12 + lVar45 * 8 + -8);
              dVar24 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                 (fun_10,left_05,right_06,pVVar43,(idx_t)pSVar38);
              *(double *)(pdVar17 + (long)pSVar38 * 8) = dVar24;
              pSVar38 = (SelectionVector *)
                        ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar38->sel_vector)->
                                super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                )._M_t.
                                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                ._M_t + 1);
              lVar45 = lVar45 + 2;
            } while (count != pSVar38);
          }
        }
        else {
          puVar1 = (undefined1 *)
                   ((long)&count[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 7);
          if ((undefined1 *)0x3f < puVar1) {
            uVar40 = 0;
            pSVar38 = (SelectionVector *)0x0;
            do {
              puVar8 = (pVVar43->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar8 == (unsigned_long *)0x0) {
                pSVar34 = (SelectionVector *)
                          &pSVar38[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count <= pSVar34) {
                  pSVar34 = count;
                }
LAB_01baf06f:
                pSVar37 = pSVar38;
                if (pSVar38 < pSVar34) {
                  lVar45 = (long)pSVar38 * 2 + 1;
                  do {
                    fun_09.lhs_data = (double **)local_138._8_8_;
                    fun_09.func_name = (string *)local_138._0_8_;
                    fun_09.rhs_data = (double **)local_128[0].sel_vector;
                    left_04.length = *(uint64_t *)(pdVar11 + lVar45 * 8);
                    left_04.offset = *(uint64_t *)(pdVar11 + lVar45 * 8 + -8);
                    right_05.length = *(uint64_t *)(pdVar12 + lVar45 * 8);
                    right_05.offset = *(uint64_t *)(pdVar12 + lVar45 * 8 + -8);
                    dVar24 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                       (fun_09,left_04,right_05,pVVar43,(idx_t)pSVar38);
                    *(double *)(pdVar17 + (long)pSVar38 * 8) = dVar24;
                    pSVar38 = (SelectionVector *)
                              ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar38->sel_vector)
                                      ->
                                      super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                      )._M_t.
                                      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                      ._M_t + 1);
                    lVar45 = lVar45 + 2;
                    pSVar37 = pSVar34;
                  } while (pSVar34 != pSVar38);
                }
              }
              else {
                uVar15 = puVar8[uVar40];
                pSVar34 = (SelectionVector *)
                          &pSVar38[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (count <= pSVar34) {
                  pSVar34 = count;
                }
                pSVar37 = pSVar34;
                if (uVar15 != 0) {
                  if (uVar15 == 0xffffffffffffffff) goto LAB_01baf06f;
                  pSVar37 = pSVar38;
                  if (pSVar38 < pSVar34) {
                    uVar39 = (long)pSVar38 << 4 | 8;
                    uVar44 = 0;
                    do {
                      if ((uVar15 >> (uVar44 & 0x3f) & 1) != 0) {
                        fun_08.lhs_data = (double **)local_138._8_8_;
                        fun_08.func_name = (string *)local_138._0_8_;
                        fun_08.rhs_data = (double **)local_128[0].sel_vector;
                        left_03.length = *(uint64_t *)(pdVar11 + uVar39);
                        left_03.offset = *(uint64_t *)(pdVar11 + (uVar39 - 8));
                        right_04.length = *(uint64_t *)(pdVar12 + uVar39);
                        right_04.offset = *(uint64_t *)(pdVar12 + (uVar39 - 8));
                        dVar24 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                           (fun_08,left_03,right_04,pVVar43,
                                            (long)&(((unsafe_unique_array<unsigned_long> *)
                                                    &pSVar38->sel_vector)->
                                                                                                      
                                                  super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                                  )._M_t.
                                                  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                                  ._M_t + uVar44);
                        *(double *)(pdVar17 + uVar44 * 8 + (long)pSVar38 * 8) = dVar24;
                      }
                      uVar44 = uVar44 + 1;
                      uVar39 = uVar39 + 0x10;
                      pSVar37 = pSVar34;
                    } while ((long)pSVar34 - (long)pSVar38 != uVar44);
                  }
                }
              }
              uVar40 = uVar40 + 1;
              pSVar38 = pSVar37;
            } while (uVar40 != (ulong)puVar1 >> 6);
          }
        }
        goto LAB_01bae6d8;
      }
      plVar10 = (list_entry_t *)vec->data;
      puVar8 = (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar11 = vec_00->data;
      if ((puVar8 == (unsigned_long *)0x0) || ((*puVar8 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar12 = result->data;
        FlatVector::VerifyFlatVector(result);
        pVVar43 = &result->validity;
        FlatVector::VerifyFlatVector(vec_00);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
        if ((vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_c8.sel = count;
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          }
          (pVVar43->super_TemplatedValidityMask<unsigned_long>).validity_mask = (unsigned_long *)0x0
          ;
        }
        else {
          local_c8.sel = count;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)local_138,(unsigned_long **)&vec_00->validity,
                     (unsigned_long *)&local_c8);
          uVar26 = local_138._8_8_;
          uVar25 = local_138._0_8_;
          local_138._0_8_ = (SelectionVector *)0x0;
          local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)uVar25;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar26;
          if ((p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
          }
          pTVar33 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar33->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          (pVVar43->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)_Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          if (_Var14.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
              (unsigned_long *)0x0) {
            puVar1 = (undefined1 *)
                     ((long)&count[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + 7);
            local_138._0_8_ = psVar41;
            local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78;
            local_128[0].sel_vector = (sel_t *)&local_80;
            if ((undefined1 *)0x3f < puVar1) {
              pSVar38 = (SelectionVector *)0x0;
              uVar40 = 0;
              do {
                puVar8 = (pVVar43->super_TemplatedValidityMask<unsigned_long>).validity_mask;
                if (puVar8 == (unsigned_long *)0x0) {
                  pSVar34 = (SelectionVector *)
                            &pSVar38[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount;
                  if (count <= pSVar34) {
                    pSVar34 = count;
                  }
LAB_01bae9e5:
                  pSVar37 = pSVar38;
                  if (pSVar38 < pSVar34) {
                    lVar46 = *plVar10;
                    puVar42 = (uint64_t *)(pdVar11 + (long)pSVar38 * 0x10 + 8);
                    do {
                      fun_04.lhs_data = (double **)local_78;
                      fun_04.func_name = psVar41;
                      fun_04.rhs_data = &local_80;
                      right_01.length = *puVar42;
                      right_01.offset = puVar42[-1];
                      dVar24 = BinaryLambdaWrapperWithNulls::
                               Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                         (fun_04,lVar46,right_01,pVVar43,(idx_t)pSVar38);
                      *(double *)(pdVar12 + (long)pSVar38 * 8) = dVar24;
                      pSVar38 = (SelectionVector *)
                                ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar38->sel_vector
                                         )->
                                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                        )._M_t.
                                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                        ._M_t + 1);
                      puVar42 = puVar42 + 2;
                      pSVar37 = pSVar34;
                    } while (pSVar34 != pSVar38);
                  }
                }
                else {
                  uVar15 = puVar8[uVar40];
                  pSVar34 = (SelectionVector *)
                            &pSVar38[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount;
                  if (count <= pSVar34) {
                    pSVar34 = count;
                  }
                  pSVar37 = pSVar34;
                  if (uVar15 != 0) {
                    if (uVar15 == 0xffffffffffffffff) goto LAB_01bae9e5;
                    pSVar37 = pSVar38;
                    if (pSVar38 < pSVar34) {
                      puVar42 = (uint64_t *)(pdVar11 + (long)pSVar38 * 0x10 + 8);
                      uVar39 = 0;
                      do {
                        if ((uVar15 >> (uVar39 & 0x3f) & 1) != 0) {
                          fun_03.lhs_data = (double **)local_78;
                          fun_03.func_name = psVar41;
                          fun_03.rhs_data = &local_80;
                          right_00.length = *puVar42;
                          right_00.offset = puVar42[-1];
                          dVar24 = BinaryLambdaWrapperWithNulls::
                                   Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                                             (fun_03,*plVar10,right_00,pVVar43,
                                              (long)&(((unsafe_unique_array<unsigned_long> *)
                                                      &pSVar38->sel_vector)->
                                                                                                          
                                                  super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                                  )._M_t.
                                                  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                                  ._M_t + uVar39);
                          *(double *)(pdVar12 + uVar39 * 8 + (long)pSVar38 * 8) = dVar24;
                        }
                        uVar39 = uVar39 + 1;
                        puVar42 = puVar42 + 2;
                        pSVar37 = pSVar34;
                      } while ((long)pSVar34 - (long)pSVar38 != uVar39);
                    }
                  }
                }
                pSVar38 = pSVar37;
                uVar40 = uVar40 + 1;
              } while (uVar40 != (ulong)puVar1 >> 6);
            }
            goto LAB_01bae6d8;
          }
        }
        local_138._0_8_ = psVar41;
        local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78;
        local_128[0].sel_vector = (sel_t *)&local_80;
        if (count != (SelectionVector *)0x0) {
          lVar46 = *plVar10;
          local_190 = (uint64_t *)(pdVar11 + 8);
          pSVar38 = (SelectionVector *)0x0;
          do {
            fun_07.lhs_data = (double **)local_138._8_8_;
            fun_07.func_name = (string *)local_138._0_8_;
            fun_07.rhs_data = (double **)local_128[0].sel_vector;
            right_03.length = *local_190;
            right_03.offset = local_190[-1];
            dVar24 = BinaryLambdaWrapperWithNulls::
                     Operation<duckdb::ListGenericFold<double,duckdb::CosineSimilarityOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,double>
                               (fun_07,lVar46,right_03,pVVar43,(idx_t)pSVar38);
            *(double *)(pdVar12 + (long)pSVar38 * 8) = dVar24;
            pSVar38 = (SelectionVector *)
                      ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar38->sel_vector)->
                              super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                              )._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t + 1);
            local_190 = local_190 + 2;
          } while (count != pSVar38);
        }
        goto LAB_01bae6d8;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
LAB_01bae6d8:
  bVar29 = DataChunk::AllConstant(local_d8);
  if (bVar29) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  return;
}

Assistant:

static void ListGenericFold(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	auto count = args.size();

	auto &lhs_vec = args.data[0];
	auto &rhs_vec = args.data[1];

	const auto lhs_count = ListVector::GetListSize(lhs_vec);
	const auto rhs_count = ListVector::GetListSize(rhs_vec);

	auto &lhs_child = ListVector::GetEntry(lhs_vec);
	auto &rhs_child = ListVector::GetEntry(rhs_vec);

	lhs_child.Flatten(lhs_count);
	rhs_child.Flatten(rhs_count);

	D_ASSERT(lhs_child.GetVectorType() == VectorType::FLAT_VECTOR);
	D_ASSERT(rhs_child.GetVectorType() == VectorType::FLAT_VECTOR);

	if (!FlatVector::Validity(lhs_child).CheckAllValid(lhs_count)) {
		throw InvalidInputException("%s: left argument can not contain NULL values", func_name);
	}

	if (!FlatVector::Validity(rhs_child).CheckAllValid(rhs_count)) {
		throw InvalidInputException("%s: right argument can not contain NULL values", func_name);
	}

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);

	BinaryExecutor::ExecuteWithNulls<list_entry_t, list_entry_t, TYPE>(
	    lhs_vec, rhs_vec, result, count,
	    [&](const list_entry_t &left, const list_entry_t &right, ValidityMask &mask, idx_t row_idx) {
		    if (left.length != right.length) {
			    throw InvalidInputException(
			        "%s: list dimensions must be equal, got left length '%d' and right length '%d'", func_name,
			        left.length, right.length);
		    }

		    if (!OP::ALLOW_EMPTY && left.length == 0) {
			    mask.SetInvalid(row_idx);
			    return TYPE();
		    }

		    return OP::Operation(lhs_data + left.offset, rhs_data + right.offset, left.length);
	    });

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}